

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O2

void __thiscall gss::LubyRestartsSchedule::did_a_restart(LubyRestartsSchedule *this)

{
  list<long_long,_std::allocator<long_long>_> *__position;
  _List_node_base *p_Var1;
  _List_const_iterator<long_long> _Var2;
  long local_18;
  
  _Var2 = std::next<std::_List_const_iterator<long_long>>((this->_current_sequence)._M_node,1);
  __position = &this->_sequence;
  if (_Var2._M_node == (_List_node_base *)__position) {
    std::__cxx11::list<long_long,std::allocator<long_long>>::
    insert<std::_List_iterator<long_long>,void>
              ((list<long_long,std::allocator<long_long>> *)__position,(const_iterator)__position,
               (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
               _M_node.super__List_node_base._M_next,(_List_iterator<long_long>)__position);
    local_18 = (long)(this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>.
                     _M_impl._M_node.super__List_node_base._M_prev[1]._M_next * 2;
    std::__cxx11::list<long_long,_std::allocator<long_long>_>::push_back(__position,&local_18);
  }
  p_Var1 = ((this->_current_sequence)._M_node)->_M_next;
  (this->_current_sequence)._M_node = p_Var1;
  this->_backtracks_remaining = (longlong)p_Var1[1]._M_next;
  return;
}

Assistant:

auto LubyRestartsSchedule::did_a_restart() -> void
{
    if (next(_current_sequence) == _sequence.end()) {
        _sequence.insert(_sequence.end(), _sequence.begin(), _sequence.end());
        _sequence.push_back(_sequence.back() * 2);
    }
    ++_current_sequence;
    _backtracks_remaining = *_current_sequence;
}